

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

int * Vec_MemHashLookup(Vec_Mem_t *p,word *pEntry)

{
  Vec_Int_t *p_00;
  uint i;
  int iVar1;
  word *__s1;
  int *local_28;
  int *pSpot;
  word *pEntry_local;
  Vec_Mem_t *p_local;
  
  p_00 = p->vTable;
  i = Vec_MemHashKey(p,pEntry);
  local_28 = Vec_IntEntryP(p_00,i);
  while( true ) {
    if (*local_28 == -1) {
      return local_28;
    }
    __s1 = Vec_MemReadEntry(p,*local_28);
    iVar1 = memcmp(__s1,pEntry,(long)p->nEntrySize << 3);
    if (iVar1 == 0) break;
    local_28 = Vec_IntEntryP(p->vNexts,*local_28);
  }
  return local_28;
}

Assistant:

static int * Vec_MemHashLookup( Vec_Mem_t * p, word * pEntry )
{
    int * pSpot = Vec_IntEntryP( p->vTable, Vec_MemHashKey(p, pEntry) );
    for ( ; *pSpot != -1; pSpot = Vec_IntEntryP(p->vNexts, *pSpot) )
        if ( !memcmp( Vec_MemReadEntry(p, *pSpot), pEntry, sizeof(word) * p->nEntrySize ) ) // equal
            return pSpot;
    return pSpot;
}